

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O2

spv_result_t
spvOpcodeTableNameLookup
          (spv_target_env env,spv_opcode_table table,char *name,spv_opcode_desc *pEntry)

{
  uint uVar1;
  spv_opcode_desc_t *psVar2;
  char *__s;
  uint32_t uVar3;
  int iVar4;
  spv_result_t sVar5;
  size_t __n;
  size_t sVar6;
  long lVar7;
  
  if (pEntry == (spv_opcode_desc *)0x0 || name == (char *)0x0) {
    sVar5 = SPV_ERROR_INVALID_POINTER;
  }
  else if (table == (spv_opcode_table)0x0) {
    sVar5 = SPV_ERROR_INVALID_TABLE;
  }
  else {
    __n = strlen(name);
    uVar3 = spvVersionForTargetEnv(env);
    uVar1 = table->count;
    for (lVar7 = 0; (ulong)uVar1 * 0x78 != lVar7; lVar7 = lVar7 + 0x78) {
      psVar2 = table->entries;
      if ((((*(uint *)((long)psVar2->operandTypes + lVar7 + 0x54) <= uVar3) &&
           (uVar3 <= *(uint *)((long)psVar2->operandTypes + lVar7 + 0x58))) ||
          (*(int *)((long)psVar2->operandTypes + lVar7 + 0x44) != 0)) ||
         (*(int *)((long)psVar2->operandTypes + lVar7 + -0x10) != 0)) {
        __s = *(char **)((long)psVar2->operandTypes + lVar7 + -0x1c);
        sVar6 = strlen(__s);
        if ((__n == sVar6) && (iVar4 = strncmp(name,__s,__n), iVar4 == 0)) {
          *pEntry = (spv_opcode_desc)((long)psVar2->operandTypes + lVar7 + -0x1c);
          return SPV_SUCCESS;
        }
      }
    }
    sVar5 = SPV_ERROR_INVALID_LOOKUP;
  }
  return sVar5;
}

Assistant:

spv_result_t spvOpcodeTableNameLookup(spv_target_env env,
                                      const spv_opcode_table table,
                                      const char* name,
                                      spv_opcode_desc* pEntry) {
  if (!name || !pEntry) return SPV_ERROR_INVALID_POINTER;
  if (!table) return SPV_ERROR_INVALID_TABLE;

  // TODO: This lookup of the Opcode table is suboptimal! Binary sort would be
  // preferable but the table requires sorting on the Opcode name, but it's
  // static const initialized and matches the order of the spec.
  const size_t nameLength = strlen(name);
  const auto version = spvVersionForTargetEnv(env);
  for (uint64_t opcodeIndex = 0; opcodeIndex < table->count; ++opcodeIndex) {
    const spv_opcode_desc_t& entry = table->entries[opcodeIndex];
    // We considers the current opcode as available as long as
    // 1. The target environment satisfies the minimal requirement of the
    //    opcode; or
    // 2. There is at least one extension enabling this opcode.
    //
    // Note that the second rule assumes the extension enabling this instruction
    // is indeed requested in the SPIR-V code; checking that should be
    // validator's work.
    if (((version >= entry.minVersion && version <= entry.lastVersion) ||
         entry.numExtensions > 0u || entry.numCapabilities > 0u) &&
        nameLength == strlen(entry.name) &&
        !strncmp(name, entry.name, nameLength)) {
      // NOTE: Found out Opcode!
      *pEntry = &entry;
      return SPV_SUCCESS;
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}